

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O0

void __thiscall
gutil::Parameter::Parameter(Parameter *this,int argc,char **argv,char **pdef,char *creator)

{
  byte bVar1;
  IOException *this_00;
  char *pcVar2;
  long lVar3;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  char *in_R8;
  string s_1;
  int i_1;
  string s;
  ifstream in;
  int i;
  undefined7 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc70;
  value_type *in_stack_fffffffffffffc78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  allocator *__x;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc90;
  undefined7 in_stack_fffffffffffffca8;
  byte in_stack_fffffffffffffcaf;
  string *in_stack_fffffffffffffcb8;
  string *s_00;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [32];
  int local_2b8;
  allocator local_2b1;
  string local_2b0 [38];
  undefined1 local_28a;
  allocator local_289;
  string local_288 [32];
  string local_268 [48];
  long local_238 [65];
  int local_2c;
  char *local_28;
  long local_20;
  long local_18;
  int local_c;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x116a60);
  s_00 = (string *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x116a73);
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x116a9c);
  local_2c = 1;
  do {
    if (local_c <= local_2c) {
      local_2b8 = 0;
      while (*(long *)(local_20 + (long)local_2b8 * 8) != 0) {
        this_01 = *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    **)(local_20 + (long)local_2b8 * 8);
        __x = &local_2d9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2d8,(char *)this_01,__x);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_01,in_stack_fffffffffffffc78);
        anon_unknown_3::getValue(in_stack_fffffffffffffcb8);
        std::__cxx11::string::operator=(local_2d8,local_300);
        std::__cxx11::string::~string(local_300);
        lVar3 = std::__cxx11::string::size();
        if ((lVar3 != 0) &&
           (in_stack_fffffffffffffc78 =
                 (value_type *)std::__cxx11::string::operator[]((ulong)local_2d8),
           *in_stack_fffffffffffffc78 == (value_type)0x2d)) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(in_stack_fffffffffffffc90,(value_type *)__x);
        }
        std::__cxx11::string::~string(local_2d8);
        local_2b8 = local_2b8 + 1;
      }
      if (local_28 != (char *)0x0) {
        std::__cxx11::string::operator=((string *)(in_RDI + 1),local_28);
      }
      in_RDI[2]._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)0xffffffffffffffff;
      in_RDI[2]._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      return;
    }
    if (**(char **)(local_18 + (long)local_2c * 8) == '@') {
      std::ifstream::ifstream(local_238);
      std::__cxx11::string::string(local_268);
      std::ios::exceptions((int)local_238 + (int)*(undefined8 *)(local_238[0] + -0x18));
      std::ifstream::open((char *)local_238,
                          (int)*(undefined8 *)(local_18 + (long)local_2c * 8) + _S_app);
      bVar1 = std::ios::good();
      if ((bVar1 & 1) == 0) {
        local_28a = 1;
        this_00 = (IOException *)__cxa_allocate_exception(0x28);
        pcVar2 = (char *)(*(long *)(local_18 + (long)local_2c * 8) + 1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_288,pcVar2,&local_289);
        IOException::IOException
                  (this_00,(string *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
        local_28a = 0;
        __cxa_throw(this_00,&IOException::typeinfo,IOException::~IOException);
      }
      while (in_stack_fffffffffffffcaf = std::ios::good(), (in_stack_fffffffffffffcaf & 1) != 0) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,local_268);
        trim(s_00);
        lVar3 = std::__cxx11::string::size();
        if (lVar3 != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
        }
      }
      std::ifstream::close();
      std::__cxx11::string::~string(local_268);
      std::ifstream::~ifstream(local_238);
    }
    else {
      pcVar2 = *(char **)(local_18 + (long)local_2c * 8);
      in_stack_fffffffffffffc90 = in_RDI;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b0,pcVar2,&local_2b1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_fffffffffffffc70,
                  (value_type *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
      std::__cxx11::string::~string(local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

Parameter::Parameter(int argc, char *argv[], const char *pdef[],
                     const char *creator)
{
  for (int i=1; i<argc; i++)
  {
    if (argv[i][0] == '@')
    {
      std::ifstream in;
      std::string s;

      in.exceptions(std::ios_base::badbit);
      in.open(argv[i]+1);

      if (!in.good())
      {
        throw IOException(argv[i]+1);
      }

      while (in.good())
      {
        getline(in, s);

        trim(s);

        if (s.size() > 0)
        {
          list.push_back(s);
        }
      }

      in.close();
    }
    else
    {
      list.push_back(std::string(argv[i]));
    }
  }

  for (int i=0; pdef[i] != 0; i++)
  {
    std::string s=pdef[i];
    def.push_back(s);

    s=getValue(s);

    if (s.size() > 0 && s[0] == '-')
    {
      allparam.insert(s);
    }
  }

  if (creator != 0)
  {
    creat=creator;
  }

  cparam=-1;
  pos=0;
}